

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall
cs_impl::any::make_constant<cs::range_type,cs::numeric_const&,cs::numeric_const&,int>
          (any *this,numeric *args,numeric *args_1,int *args_2)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  baseHolder *pbVar7;
  proxy *ppVar8;
  
  if ((_DAT_0025c658 == 0) || (cs::global_thread_counter != 0)) {
    pbVar7 = (baseHolder *)operator_new(0x70);
  }
  else {
    pbVar7 = *(baseHolder **)
              (&holder<std::shared_ptr<cs::name_space>>::allocator + _DAT_0025c658 * 8);
    _DAT_0025c658 = _DAT_0025c658 + -1;
  }
  pbVar7->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_00251ee0;
  bVar1 = args->type;
  pp_Var4 = (_func_int **)(args_1->data)._int;
  pp_Var5 = *(_func_int ***)((long)&args_1->data + 8);
  bVar2 = args_1->type;
  iVar3 = *args_2;
  pp_Var6 = *(_func_int ***)((long)&args->data + 8);
  pbVar7[2]._vptr_baseHolder = (_func_int **)(args->data)._int;
  pbVar7[3]._vptr_baseHolder = pp_Var6;
  *(bool *)&pbVar7[4]._vptr_baseHolder = bVar1;
  pbVar7[6]._vptr_baseHolder = pp_Var4;
  pbVar7[7]._vptr_baseHolder = pp_Var5;
  *(bool *)&pbVar7[8]._vptr_baseHolder = bVar2;
  pbVar7[10]._vptr_baseHolder = (_func_int **)(long)iVar3;
  *(undefined1 *)&pbVar7[0xc]._vptr_baseHolder = 1;
  if ((DAT_0025be20 == 0) || (cs::global_thread_counter != 0)) {
    ppVar8 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar8 = (proxy *)(&cs::null_pointer)[DAT_0025be20];
    DAT_0025be20 = DAT_0025be20 + -1;
  }
  ppVar8->is_rvalue = false;
  ppVar8->protect_level = 2;
  ppVar8->refcount = 1;
  ppVar8->data = pbVar7;
  this->mDat = ppVar8;
  return (any)(proxy *)this;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}